

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::ScaleParameter::ByteSizeLong(ScaleParameter *this)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  ScaleParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ScaleParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0x1f) != 0) {
    bVar1 = has_filler(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->filler_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_bias_filler(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->bias_filler_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_bias_term(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_axis(this);
    if (bVar1) {
      iVar2 = axis(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_num_axes(this);
    if (bVar1) {
      iVar2 = num_axes(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t ScaleParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ScaleParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.FillerParameter filler = 3;
    if (has_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 5;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional bool bias_term = 4 [default = false];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

    // optional int32 axis = 1 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

    // optional int32 num_axes = 2 [default = 1];
    if (has_num_axes()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num_axes());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}